

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetContextActivateMetricGroups
          (zet_context_handle_t hContext,zet_device_handle_t hDevice,uint32_t count,
          zet_metric_group_handle_t *phMetricGroups)

{
  zet_pfnContextActivateMetricGroups_t pfnActivateMetricGroups;
  ze_result_t result;
  zet_metric_group_handle_t *phMetricGroups_local;
  uint32_t count_local;
  zet_device_handle_t hDevice_local;
  zet_context_handle_t hContext_local;
  
  pfnActivateMetricGroups._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c820 != (code *)0x0) {
    pfnActivateMetricGroups._4_4_ = (*DAT_0011c820)(hContext,hDevice,count,phMetricGroups);
  }
  return pfnActivateMetricGroups._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetContextActivateMetricGroups(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t count,                                 ///< [in] metric group count to activate; must be 0 if `nullptr ==
                                                        ///< phMetricGroups`
        zet_metric_group_handle_t* phMetricGroups       ///< [in][optional][range(0, count)] handles of the metric groups to activate.
                                                        ///< nullptr deactivates all previously used metric groups.
                                                        ///< all metrics groups must come from a different domains.
                                                        ///< metric query and metric stream must use activated metric groups.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnActivateMetricGroups = context.zetDdiTable.Context.pfnActivateMetricGroups;
        if( nullptr != pfnActivateMetricGroups )
        {
            result = pfnActivateMetricGroups( hContext, hDevice, count, phMetricGroups );
        }
        else
        {
            // generic implementation
        }

        return result;
    }